

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

MemoryLeakDetector * MemoryLeakWarningPlugin::getGlobalDetector(void)

{
  MemoryLeakFailure *this;
  MemoryLeakDetector *pMVar1;
  MemoryLeakDetector *unaff_retaddr;
  MemoryLeakFailure *in_stack_fffffffffffffff8;
  
  if (globalDetector == (MemoryLeakDetector *)0x0) {
    saveAndDisableNewDeleteOverloads();
    this = (MemoryLeakFailure *)operator_new(0x16dd1d);
    MemoryLeakWarningReporter::MemoryLeakWarningReporter((MemoryLeakWarningReporter *)this);
    globalReporter = this;
    pMVar1 = (MemoryLeakDetector *)operator_new(0x16dd40);
    MemoryLeakDetector::MemoryLeakDetector(unaff_retaddr,in_stack_fffffffffffffff8);
    globalDetector = pMVar1;
    restoreNewDeleteOverloads();
  }
  return globalDetector;
}

Assistant:

MemoryLeakDetector* MemoryLeakWarningPlugin::getGlobalDetector()
{
    if (globalDetector == NULLPTR) {
        saveAndDisableNewDeleteOverloads();

        globalReporter = new MemoryLeakWarningReporter;
        globalDetector = new MemoryLeakDetector(globalReporter);

        restoreNewDeleteOverloads();
    }
    return globalDetector;
}